

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart.hpp
# Opt level: O1

Lazy<cinatra::chunked_result> __thiscall
cinatra::multipart_reader_t<cinatra::coro_http_connection>::read_part_body
          (multipart_reader_t<cinatra::coro_http_connection> *this,string_view boundary)

{
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *pbVar1;
  coro_http_connection *pcVar2;
  undefined8 in_RCX;
  
  pcVar2 = (coro_http_connection *)operator_new(0xd0,(nothrow_t *)&std::nothrow);
  if (pcVar2 == (coro_http_connection *)0x0) {
    this->conn_ = (coro_http_connection *)0x0;
  }
  else {
    (pcVar2->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)read_part_body;
    (pcVar2->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)read_part_body;
    *(undefined8 *)&(pcVar2->head_buf_).field_0x30 = in_RCX;
    *(char **)&(pcVar2->head_buf_).field_0x28 = boundary._M_str;
    *(size_t *)&(pcVar2->head_buf_).field_0x20 = boundary._M_len;
    pcVar2->executor_ =
         (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)0x0;
    (pcVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.service_ =
         (service_type *)0x0;
    pbVar1 = &(pcVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>;
    (pbVar1->impl_).implementation_.super_base_implementation_type.socket_ = 0;
    (pbVar1->impl_).implementation_.super_base_implementation_type.state_ = '\0';
    *(undefined3 *)&(pbVar1->impl_).implementation_.super_base_implementation_type.field_0x5 = 0;
    *(undefined1 *)
     ((long)&(pcVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
             executor_.
             super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
             .super_any_executor_base + 0x18) = 0;
    this->conn_ = pcVar2;
    *(undefined1 *)
     &(pcVar2->head_buf_).buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
  }
  return (LazyBase<cinatra::chunked_result,_false>)(LazyBase<cinatra::chunked_result,_false>)this;
}

Assistant:

async_simple::coro::Lazy<chunked_result> read_part_body(
      std::string_view boundary) {
    chunked_result result{};
    std::error_code ec{};
    size_t size = 0;

    if (std::tie(ec, size) =
            co_await conn_->async_read_until(chunked_buf_, boundary);
        ec) {
      result.ec = ec;
      conn_->close();
      co_return result;
    }

    const char *data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
    chunked_buf_.consume(size);
    result.data = std::string_view{
        data_ptr, size - boundary.size() - 4};  //-- boundary \r\n

    if (std::tie(ec, size) =
            co_await conn_->async_read_until(chunked_buf_, CRCF);
        ec) {
      result = {};
      result.ec = ec;
      conn_->close();
      co_return result;
    }

    data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
    std::string data{data_ptr, size};
    if (size > 2) {
      constexpr std::string_view complete_flag = "--\r\n";
      if (data == complete_flag) {
        result.eof = true;
      }
    }

    chunked_buf_.consume(size);
    co_return result;
  }